

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

VOID OutputDebugStringA(LPCSTR lpOutputString)

{
  char *pcVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (lpOutputString != (LPCSTR)0x0) {
      pcVar1 = MiscGetenv("PAL_OUTPUTDEBUGSTRING");
      if (pcVar1 != (char *)0x0) {
        fprintf(_stderr,"%s",lpOutputString);
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

VOID
PALAPI
OutputDebugStringA(
        IN LPCSTR lpOutputString)
{
    PERF_ENTRY(OutputDebugStringA);
    ENTRY("OutputDebugStringA (lpOutputString=%p (%s))\n",
          lpOutputString?lpOutputString:"NULL",
          lpOutputString?lpOutputString:"NULL");

    /* as we don't support debug events, we are going to output the debug string
      to stderr instead of generating OUT_DEBUG_STRING_EVENT */
    if ( (lpOutputString != NULL) &&
         (NULL != MiscGetenv(PAL_OUTPUTDEBUGSTRING)))
    {
        fprintf(stderr, "%s", lpOutputString);
    }

    LOGEXIT("OutputDebugStringA returns\n");
    PERF_EXIT(OutputDebugStringA);
}